

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_int_to_longlong_inplace(int *intarray,long length,int *status)

{
  void *__ptr;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  long nmax;
  long firstelem;
  long ntodo;
  long ii;
  LONGLONG *aliasarray;
  LONGLONG *longlongarray;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    local_40 = 10000;
    if (in_RSI < 10000) {
      local_40 = in_RSI;
    }
    local_48 = in_RSI - local_40;
    __ptr = malloc(local_40 << 3);
    if (__ptr == (void *)0x0) {
      ffpmsg((char *)0x20665c);
      *in_RDX = 0x71;
      local_4 = 0x71;
    }
    else {
      while (0 < local_40) {
        for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
          *(long *)((long)__ptr + local_38 * 8) = (long)*(int *)(in_RDI + (local_38 + local_48) * 4)
          ;
        }
        memcpy((void *)(in_RDI + local_48 * 8),__ptr,local_40 << 3);
        if (local_48 == 0) {
          local_40 = 0;
        }
        else if (local_48 < 0x2711) {
          local_40 = local_48;
          local_48 = 0;
        }
        else {
          local_48 = local_48 + -10000;
        }
      }
      free(__ptr);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

static int fits_int_to_longlong_inplace(int *intarray, long length, int *status)

/* convert the input array of 32-bit integers into an array of 64-bit integers,
in place. This will overwrite the input array with the new longer array starting
at the same memory location.  

Note that aliasing the same memory location with pointers of different datatypes is
not allowed in strict ANSI C99, however it is  used here for efficency. In principle,
one could simply copy the input array in reverse order to the output array,
but this only works if the compiler performs the operation in strict order.  Certain
compiler optimization techniques may vioate this assumption.  Therefore, we first
copy a section of the input array to a temporary intermediate array, before copying
the longer datatype values back to the original array.
*/

{
    LONGLONG *longlongarray, *aliasarray;
    long ii, ntodo, firstelem, nmax = 10000;
    
    if (*status > 0) 
        return(*status);

    ntodo = nmax;
    if (length < nmax) ntodo = length;
    
    firstelem = length - ntodo;  /* first element to be converted */
    
    longlongarray = (LONGLONG *) malloc(ntodo * sizeof(LONGLONG));
    
    if (longlongarray == NULL)
    {
	ffpmsg("Out of memory. (fits_int_to_longlong_inplace)");
	return (*status = MEMORY_ALLOCATION);
    }

    aliasarray = (LONGLONG *) intarray; /* alias pointer to the input array */

    while (ntodo > 0) {
    
	/* do datatype conversion into temp array */
        for (ii = 0; ii < ntodo; ii++) { 
	    longlongarray[ii] = intarray[ii + firstelem];
        }

        /* copy temp array back to alias */
        memcpy(&(aliasarray[firstelem]), longlongarray, ntodo * 8);
	
        if (firstelem == 0) {  /* we are all done */
	    ntodo = 0;   
	} else {  /* recalculate ntodo and firstelem for next loop */
	    if (firstelem > nmax) {
	        firstelem -= nmax;
	    } else {
	        ntodo = firstelem;
	        firstelem = 0;
	    }
	}
    }

    free(longlongarray);
    return(*status);
}